

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlabel.cpp
# Opt level: O0

void __thiscall QLabelPrivate::~QLabelPrivate(QLabelPrivate *this)

{
  undefined8 *in_RDI;
  array<QMetaObject::Connection,_2UL> *unaff_retaddr;
  
  *in_RDI = &PTR__QLabelPrivate_00d147d8;
  std::function<QVariant_(const_QUrl_&)>::~function((function<QVariant_(const_QUrl_&)> *)0x5ad4d1);
  QPointer<QWidget>::~QPointer((QPointer<QWidget> *)0x5ad4e2);
  QCursor::~QCursor((QCursor *)(in_RDI + 0x61));
  QTextCursor::~QTextCursor((QTextCursor *)(in_RDI + 0x60));
  std::array<QMetaObject::Connection,_2UL>::~array(unaff_retaddr);
  QPointer<QMovie>::~QPointer((QPointer<QMovie> *)0x5ad526);
  std::optional<QPicture>::~optional((optional<QPicture> *)0x5ad537);
  std::optional<QIcon>::~optional((optional<QIcon> *)0x5ad548);
  QString::~QString((QString *)0x5ad559);
  QFramePrivate::~QFramePrivate((QFramePrivate *)0x5ad563);
  return;
}

Assistant:

QLabelPrivate::~QLabelPrivate()
{
}